

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O2

Pass * wasm::createOptimizeAddedConstantsPropagatePass(void)

{
  OptimizeAddedConstants *this;
  
  this = (OptimizeAddedConstants *)operator_new(0x1a0);
  OptimizeAddedConstants::OptimizeAddedConstants(this,true);
  return (Pass *)this;
}

Assistant:

Pass* createOptimizeAddedConstantsPropagatePass() {
  return new OptimizeAddedConstants(true);
}